

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void av1_nonrd_pick_intra_mode
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_cost,BLOCK_SIZE bsize,
               PICK_MODE_CONTEXT *ctx)

{
  TX_SIZE TVar1;
  int iVar2;
  byte above_mode;
  byte left_mode;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  BLOCK_SIZE in_CL;
  void *in_RDX;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  long in_R8;
  uint intra_ref_frame_cost;
  TxfmSearchInfo *txfm_info;
  _Bool prune;
  _Bool try_palette;
  uint best_sad_norm;
  uint thresh_sad;
  int skip_ctx;
  PREDICTION_MODE this_mode;
  int mode_index;
  int mi_col;
  int mi_row;
  uint source_variance;
  int left_ctx;
  int above_ctx;
  PREDICTION_MODE L;
  PREDICTION_MODE A;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  PREDICTION_MODE best_mode;
  int *bmode_costs;
  BLOCK_SIZE tx_bsize;
  TxfmSearchParams *txfm_params;
  estimate_block_intra_args args;
  RD_STATS best_rdc;
  RD_STATS this_rdc;
  MB_MODE_INFO *mi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  RD_STATS *in_stack_00000860;
  PICK_MODE_CONTEXT *in_stack_00000868;
  uint in_stack_00000870;
  BLOCK_SIZE in_stack_00000877;
  MACROBLOCK *in_stack_00000878;
  AV1_COMP *in_stack_00000880;
  int64_t in_stack_000008c0;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar7;
  undefined4 in_stack_fffffffffffffedc;
  MB_MODE_INFO *in_stack_fffffffffffffee0;
  TxfmSearchInfo *pTVar8;
  undefined2 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeea;
  int in_stack_fffffffffffffef4;
  int local_104;
  MB_MODE_INFO *left_mi_00;
  MB_MODE_INFO *above_mi_00;
  int in_stack_ffffffffffffff28;
  BLOCK_SIZE plane_bsize;
  BLOCK_SIZE this_mode_00;
  MACROBLOCKD *xd_00;
  estimate_block_intra_args local_b8;
  RD_STATS local_90;
  RD_STATS local_68;
  MB_MODE_INFO *local_40;
  MACROBLOCKD *local_38;
  AV1_COMMON *local_30;
  long local_28;
  BLOCK_SIZE local_19;
  void *local_18;
  MACROBLOCK *local_10;
  AV1_COMP *local_8;
  
  local_30 = &in_RDI->common;
  local_38 = &in_RSI->e_mbd;
  local_40 = *(in_RSI->e_mbd).mi;
  local_28 = in_R8;
  local_19 = in_CL;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  init_estimate_block_intra_args(&local_b8,in_RDI,in_RSI);
  if (""[local_19] < ""[(local_10->txfm_search_params).tx_mode_search_type]) {
    TVar1 = ""[local_19];
  }
  else {
    TVar1 = ""[(local_10->txfm_search_params).tx_mode_search_type];
  }
  local_40->tx_size = TVar1;
  if ((((local_8->sf).rt_sf.prune_intra_mode_using_best_sad_so_far & 1U) != 0) &&
     (local_19 == txsize_to_bsize[local_40->tx_size])) {
    local_b8.prune_mode_based_on_sad = true;
  }
  plane_bsize = BLOCK_4X4;
  above_mi_00 = local_38->above_mbmi;
  left_mi_00 = local_38->left_mbmi;
  above_mode = av1_above_block_mode(above_mi_00);
  left_mode = av1_left_block_mode(left_mi_00);
  uVar4 = local_10->source_variance;
  xd_00 = (MACROBLOCKD *)
          ((local_10->mode_costs).y_mode_costs[intra_mode_context[above_mode]] +
          intra_mode_context[left_mode]);
  iVar6 = local_38->mi_row;
  iVar2 = local_38->mi_col;
  av1_invalid_rd_stats(&local_90);
  av1_invalid_rd_stats(&local_68);
  init_mbmi_nonrd(in_stack_fffffffffffffee0,
                  (PREDICTION_MODE)((uint)in_stack_fffffffffffffedc >> 0x18),
                  (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffffedc >> 0x10),
                  (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffffedc >> 8),
                  (AV1_COMMON *)
                  CONCAT17(in_stack_fffffffffffffed7,
                           CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)));
  local_40->mv[1].as_int = 0x80008000;
  local_40->mv[0].as_int = 0x80008000;
  for (local_104 = 0; local_104 < 4; local_104 = local_104 + 1) {
    this_mode_00 = ""[local_104];
    if (((((local_10->source_variance != 0) || (iVar2 != 0)) ||
         ((iVar6 != 0 || ((local_19 < BLOCK_32X32 || (this_mode_00 == BLOCK_4X4)))))) &&
        ((((local_8->sf).rt_sf.prune_h_pred_using_best_mode_so_far & 1U) == 0 ||
         ((this_mode_00 != BLOCK_8X4 || (plane_bsize != BLOCK_4X8)))))) &&
       ((_Var3 = should_prune_intra_modes_using_neighbors
                           (local_38,(_Bool)((local_8->sf).rt_sf.
                                             enable_intra_mode_pruning_using_neighbors & 1),
                            this_mode_00,above_mode,left_mode), !_Var3 ||
        ((((this_mode_00 != BLOCK_4X8 && (this_mode_00 != BLOCK_8X4)) || (0x32 < uVar4)) &&
         ((plane_bsize != BLOCK_4X4 || (this_mode_00 != BLOCK_32X32)))))))) {
      local_68.rate = 0;
      local_68.dist = 0;
      local_b8.skippable = 1;
      local_b8.rdc = &local_68;
      local_40->mode = this_mode_00;
      local_b8.mode = this_mode_00;
      av1_foreach_transformed_block_in_plane
                (xd_00,plane_bsize,in_stack_ffffffffffffff28,
                 (foreach_transformed_block_visitor)above_mi_00,left_mi_00);
      if (local_68.rate != 0x7fffffff) {
        in_stack_fffffffffffffef4 = av1_get_skip_txfm_context(local_38);
        if (local_b8.skippable == 0) {
          local_68.rate =
               (local_10->mode_costs).skip_txfm_cost[in_stack_fffffffffffffef4][0] + local_68.rate;
        }
        else {
          local_68.rate = (local_10->mode_costs).skip_txfm_cost[in_stack_fffffffffffffef4][1];
        }
        local_68.rate =
             *(int *)((long)(xd_00->plane[0].pre + -2) + (ulong)this_mode_00 * 4) + local_68.rate;
        local_68.rdcost =
             ((long)local_68.rate * (long)local_10->rdmult + 0x100 >> 9) + local_68.dist * 0x80;
        if ((local_68.rdcost < local_90.rdcost) &&
           (memcpy(&local_90,&local_68,0x28), plane_bsize = this_mode_00, local_68.skip_txfm == '\0'
           )) {
          memset(*(void **)(local_28 + 0x118),0,(long)*(int *)(local_28 + 0x1a0));
          plane_bsize = this_mode_00;
        }
      }
    }
  }
  uVar4 = 0x14;
  if (1 < (local_8->sf).rt_sf.prune_palette_search_nonrd) {
    uVar4 = 100;
  }
  uVar5 = local_b8.best_sad >> (""[local_19] + ""[local_19] & 0x1f);
  uVar7 = false;
  if (((local_8->oxcf).tool_cfg.enable_palette & 1U) != 0) {
    iVar6 = av1_allow_palette((uint)((local_8->common).features.allow_screen_content_tools & 1),
                              local_40->bsize);
    uVar7 = iVar6 != 0;
  }
  if (0 < (local_8->sf).rt_sf.prune_palette_search_nonrd) {
    if ((((local_b8.prune_mode_based_on_sad & 1U) == 0) ||
        (in_stack_fffffffffffffeea = false, uVar4 < uVar5)) &&
       (in_stack_fffffffffffffeea = false, local_19 < BLOCK_16X32)) {
      in_stack_fffffffffffffeea = 200 < local_10->source_variance;
    }
    uVar7 = (uVar7 & in_stack_fffffffffffffeea) != 0;
  }
  if ((bool)uVar7 != false) {
    pTVar8 = &local_10->txfm_search_info;
    iVar6 = 0x40;
    if (uVar5 < 500) {
      iVar6 = 0x20;
    }
    local_10->color_palette_thresh = iVar6;
    av1_search_palette_mode_luma
              (in_stack_00000880,in_stack_00000878,in_stack_00000877,in_stack_00000870,
               in_stack_00000868,in_stack_00000860,in_stack_000008c0);
    if (local_68.rdcost < local_90.rdcost) {
      plane_bsize = BLOCK_4X4;
      local_40->mv[0].as_int = 0x80008000;
      local_40->mv[1].as_int = 0x80008000;
      local_90.rate = local_68.rate;
      local_90.dist = local_68.dist;
      local_90.rdcost = local_68.rdcost;
      if (local_68.skip_txfm == '\0') {
        memcpy(*(void **)(local_28 + 0x118),pTVar8->blk_skip,(long)*(int *)(local_28 + 0x1a0));
      }
      if (*local_38->tx_type_map != '\0') {
        memcpy(*(void **)(local_28 + 0x198),local_38->tx_type_map,(long)*(int *)(local_28 + 0x1a0));
      }
    }
    else {
      memset(&local_40->palette_mode_info,0,0x32);
    }
  }
  local_40->mode = plane_bsize;
  local_40->uv_mode = '\0';
  memcpy(local_18,&local_90,0x28);
  iVar6 = is_lossless_requested(&(local_8->oxcf).rc_cfg);
  if (iVar6 != 0) {
    (local_10->txfm_search_info).skip_txfm = '\0';
    memset(*(void **)(local_28 + 0x118),0,(long)*(int *)(local_28 + 0x1a0));
  }
  store_coding_context_nonrd
            ((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffef4,uVar4),
             (PICK_MODE_CONTEXT *)
             CONCAT44(uVar5,CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffeea,
                                                    in_stack_fffffffffffffee8))));
  return;
}

Assistant:

void av1_nonrd_pick_intra_mode(AV1_COMP *cpi, MACROBLOCK *x, RD_STATS *rd_cost,
                               BLOCK_SIZE bsize, PICK_MODE_CONTEXT *ctx) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  RD_STATS this_rdc, best_rdc;
  struct estimate_block_intra_args args;
  init_estimate_block_intra_args(&args, cpi, x);
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  mi->tx_size =
      AOMMIN(max_txsize_lookup[bsize],
             tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]);
  assert(IMPLIES(xd->lossless[mi->segment_id], mi->tx_size == TX_4X4));
  const BLOCK_SIZE tx_bsize = txsize_to_bsize[mi->tx_size];

  // If the current block size is the same as the transform block size, enable
  // mode pruning based on the best SAD so far.
  if (cpi->sf.rt_sf.prune_intra_mode_using_best_sad_so_far && bsize == tx_bsize)
    args.prune_mode_based_on_sad = true;

  int *bmode_costs;
  PREDICTION_MODE best_mode = DC_PRED;
  const MB_MODE_INFO *above_mi = xd->above_mbmi;
  const MB_MODE_INFO *left_mi = xd->left_mbmi;
  const PREDICTION_MODE A = av1_above_block_mode(above_mi);
  const PREDICTION_MODE L = av1_left_block_mode(left_mi);
  const int above_ctx = intra_mode_context[A];
  const int left_ctx = intra_mode_context[L];
  const unsigned int source_variance = x->source_variance;
  bmode_costs = x->mode_costs.y_mode_costs[above_ctx][left_ctx];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_invalid_rd_stats(&best_rdc);
  av1_invalid_rd_stats(&this_rdc);

  init_mbmi_nonrd(mi, DC_PRED, INTRA_FRAME, NONE_FRAME, cm);
  mi->mv[0].as_int = mi->mv[1].as_int = INVALID_MV;

  // Change the limit of this loop to add other intra prediction
  // mode tests.
  for (int mode_index = 0; mode_index < RTC_INTRA_MODES; ++mode_index) {
    PREDICTION_MODE this_mode = intra_mode_list[mode_index];

    // Force DC for spatially flat block for large bsize, on top-left corner.
    // This removed potential artifact observed in gray scale image for high Q.
    if (x->source_variance == 0 && mi_col == 0 && mi_row == 0 &&
        bsize >= BLOCK_32X32 && this_mode > 0)
      continue;

    // As per the statistics generated for intra mode evaluation in the nonrd
    // path, it is found that the probability of H_PRED mode being the winner is
    // very low when the best mode so far is V_PRED (out of DC_PRED and V_PRED).
    // If V_PRED is the winner mode out of DC_PRED and V_PRED, it could imply
    // the presence of a vertically dominant pattern. Hence, H_PRED mode is not
    // evaluated.
    if (cpi->sf.rt_sf.prune_h_pred_using_best_mode_so_far &&
        this_mode == H_PRED && best_mode == V_PRED)
      continue;

    if (should_prune_intra_modes_using_neighbors(
            xd, cpi->sf.rt_sf.enable_intra_mode_pruning_using_neighbors,
            this_mode, A, L)) {
      // Prune V_PRED and H_PRED if source variance of the block is less than
      // or equal to 50. The source variance threshold is obtained empirically.
      if ((this_mode == V_PRED || this_mode == H_PRED) && source_variance <= 50)
        continue;

      // As per the statistics, probability of SMOOTH_PRED being the winner is
      // low when best mode so far is DC_PRED (out of DC_PRED, V_PRED and
      // H_PRED). Hence, SMOOTH_PRED mode is not evaluated.
      if (best_mode == DC_PRED && this_mode == SMOOTH_PRED) continue;
    }

    this_rdc.dist = this_rdc.rate = 0;
    args.mode = this_mode;
    args.skippable = 1;
    args.rdc = &this_rdc;
    mi->mode = this_mode;
    av1_foreach_transformed_block_in_plane(xd, bsize, AOM_PLANE_Y,
                                           av1_estimate_block_intra, &args);

    if (this_rdc.rate == INT_MAX) continue;

    const int skip_ctx = av1_get_skip_txfm_context(xd);
    if (args.skippable) {
      this_rdc.rate = x->mode_costs.skip_txfm_cost[skip_ctx][1];
    } else {
      this_rdc.rate += x->mode_costs.skip_txfm_cost[skip_ctx][0];
    }
    this_rdc.rate += bmode_costs[this_mode];
    this_rdc.rdcost = RDCOST(x->rdmult, this_rdc.rate, this_rdc.dist);

    if (this_rdc.rdcost < best_rdc.rdcost) {
      best_rdc = this_rdc;
      best_mode = this_mode;
      if (!this_rdc.skip_txfm) {
        memset(ctx->blk_skip, 0,
               sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
      }
    }
  }

  const unsigned int thresh_sad =
      cpi->sf.rt_sf.prune_palette_search_nonrd > 1 ? 100 : 20;
  const unsigned int best_sad_norm =
      args.best_sad >>
      (b_width_log2_lookup[bsize] + b_height_log2_lookup[bsize]);

  // Try palette if it's enabled.
  bool try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mi->bsize);
  if (cpi->sf.rt_sf.prune_palette_search_nonrd > 0) {
    bool prune =
        (!args.prune_mode_based_on_sad || best_sad_norm > thresh_sad) &&
        bsize <= BLOCK_16X16 && x->source_variance > 200;
    try_palette &= prune;
  }
  if (try_palette) {
    const TxfmSearchInfo *txfm_info = &x->txfm_search_info;
    const unsigned int intra_ref_frame_cost = 0;
    x->color_palette_thresh = (best_sad_norm < 500) ? 32 : 64;

    // Search palette mode for Luma plane in intra frame.
    av1_search_palette_mode_luma(cpi, x, bsize, intra_ref_frame_cost, ctx,
                                 &this_rdc, best_rdc.rdcost);
    // Update best mode data.
    if (this_rdc.rdcost < best_rdc.rdcost) {
      best_mode = DC_PRED;
      mi->mv[0].as_int = INVALID_MV;
      mi->mv[1].as_int = INVALID_MV;
      best_rdc.rate = this_rdc.rate;
      best_rdc.dist = this_rdc.dist;
      best_rdc.rdcost = this_rdc.rdcost;
      if (!this_rdc.skip_txfm) {
        memcpy(ctx->blk_skip, txfm_info->blk_skip,
               sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
      }
      if (xd->tx_type_map[0] != DCT_DCT)
        av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    } else {
      av1_zero(mi->palette_mode_info);
    }
  }

  mi->mode = best_mode;
  // Keep DC for UV since mode test is based on Y channel only.
  mi->uv_mode = UV_DC_PRED;
  *rd_cost = best_rdc;

  // For lossless: always force the skip flags off.
  // Even though the blk_skip is set to 0 above in the rdcost comparison,
  // do it here again in case the above logic changes.
  if (is_lossless_requested(&cpi->oxcf.rc_cfg)) {
    x->txfm_search_info.skip_txfm = 0;
    memset(ctx->blk_skip, 0,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
  }

#if CONFIG_INTERNAL_STATS
  store_coding_context_nonrd(x, ctx, mi->mode);
#else
  store_coding_context_nonrd(x, ctx);
#endif  // CONFIG_INTERNAL_STATS
}